

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O1

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,1ul>,mp::PLConParams,mp::PLId>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId> *cfc,
               ItemNamer *vnam)

{
  Buffer<char> *pBVar1;
  size_t sVar2;
  char *pcVar3;
  size_t __n;
  ptrdiff_t _Num;
  ulong uVar4;
  array<int,_1UL> *__range2;
  char *str;
  
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar4 = pBVar1->size_ + 2;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
  }
  pcVar3 = pBVar1->ptr_;
  sVar2 = pBVar1->size_;
  (pcVar3 + sVar2)[0] = 'P';
  (pcVar3 + sVar2)[1] = 'L';
  pBVar1->size_ = uVar4;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = '(';
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = '[';
  pcVar3 = ItemNamer::at(vnam,(long)(cfc->args_)._M_elems[0]);
  __n = strlen(pcVar3);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar4 = pBVar1->size_ + __n;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
  }
  if (__n != 0) {
    memmove(pBVar1->ptr_ + pBVar1->size_,pcVar3,__n);
  }
  pBVar1->size_ = uVar4;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = ']';
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar4 = pBVar1->size_ + 2;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
  }
  pcVar3 = pBVar1->ptr_;
  sVar2 = pBVar1->size_;
  (pcVar3 + sVar2)[0] = ',';
  (pcVar3 + sVar2)[1] = ' ';
  pBVar1->size_ = uVar4;
  WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>>(wrt,&cfc->params_);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = ')';
  return;
}

Assistant:

inline void WriteModelItem(
    Writer& wrt,
    const CustomConstraintData<A,P,I>& cfc,
    ItemNamer& vnam) {
  wrt << cfc.GetTypeName();
  wrt << '(';
  WriteModelItem(wrt, cfc.GetArguments(), vnam);
  wrt << ", ";
  WriteModelItemParameters(wrt, cfc.GetParameters());
  wrt << ')';
}